

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_rwkv6::llm_build_rwkv6
          (llm_build_rwkv6 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  pointer plVar5;
  ggml_context *pgVar6;
  size_t sVar7;
  size_t sVar8;
  ggml_context *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *state_copy;
  ggml_tensor *state_mask;
  ulong uVar11;
  ggml_tensor *pgVar12;
  undefined8 uVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ggml_tensor *pgVar17;
  ggml_tensor *cur;
  ggml_tensor *x_prev;
  int iVar18;
  int il;
  long lVar19;
  llama_ubatch *plVar20;
  ggml_tensor *local_90;
  long local_80;
  
  llm_graph_context::llm_graph_context((llm_graph_context *)this,params);
  (this->super_llm_build_rwkv6_base).model = model;
  if (((this->super_llm_build_rwkv6_base).super_llm_graph_context.hparams)->token_shift_count == 2)
  {
    pgVar10 = llm_graph_context::build_inp_embd((llm_graph_context *)this,model->tok_embd);
    pgVar10 = llm_graph_context::build_norm
                        ((llm_graph_context *)this,pgVar10,model->tok_norm,model->tok_norm_b,
                         LLM_NORM,-1);
    state_copy = llm_graph_context::build_inp_s_copy((llm_graph_context *)this);
    state_mask = llm_graph_context::build_inp_s_mask((llm_graph_context *)this);
    plVar20 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ubatch;
    uVar1 = ((this->super_llm_build_rwkv6_base).super_llm_graph_context.hparams)->n_embd;
    uVar11 = (ulong)uVar1;
    uVar2 = plVar20->n_seq_tokens;
    uVar3 = plVar20->n_seqs;
    iVar18 = uVar2 - 1;
    local_80 = 0;
    for (lVar19 = 0; lVar19 < (this->super_llm_build_rwkv6_base).super_llm_graph_context.n_layer;
        lVar19 = lVar19 + 1) {
      plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar10 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0,
                                pgVar10,uVar11,uVar2,uVar3);
      il = (int)lVar19;
      pgVar12 = llm_graph_context::build_rwkv_token_shift_load
                          ((llm_graph_context *)this,gf,state_copy,state_mask,
                           (this->super_llm_build_rwkv6_base).super_llm_graph_context.ubatch,il);
      uVar13 = ggml_view_3d((this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0,pgVar12,
                            uVar11,1,uVar3,pgVar12->nb[1]);
      pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
      sVar7 = pgVar12->nb[1];
      sVar8 = pgVar12->nb[2];
      lVar14 = ggml_element_size(pgVar12);
      uVar15 = ggml_view_3d(pgVar6,pgVar12,uVar11,1,uVar3,sVar7,sVar8,lVar14 * uVar11);
      pgVar12 = llm_graph_context::build_norm
                          ((llm_graph_context *)this,pgVar10,
                           *(ggml_tensor **)((long)&plVar5->attn_norm + local_80),
                           *(ggml_tensor **)((long)&plVar5->attn_norm_b + local_80),LLM_NORM,il);
      llm_graph_context::cb((llm_graph_context *)this,pgVar12,"attn_norm",il);
      pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
      uVar16 = ggml_view_3d(pgVar6,pgVar12,uVar11,iVar18,uVar3,pgVar12->nb[1],pgVar12->nb[2],0);
      pgVar17 = (ggml_tensor *)ggml_concat(pgVar6,uVar13,uVar16,1);
      plVar20 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ubatch;
      pgVar17 = llm_build_rwkv6_base::build_rwkv6_time_mix
                          (&this->super_llm_build_rwkv6_base,gf,pgVar12,pgVar17,state_copy,
                           state_mask,plVar20,il);
      local_90 = (ggml_tensor *)
                 ggml_add((this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0,pgVar17,
                          pgVar10,plVar20);
      llm_graph_context::cb((llm_graph_context *)this,local_90,"ffn_inp",il);
      cur = llm_graph_context::build_norm
                      ((llm_graph_context *)this,local_90,
                       *(ggml_tensor **)((long)&plVar5->attn_norm_2 + local_80),
                       *(ggml_tensor **)((long)&plVar5->attn_norm_2_b + local_80),LLM_NORM,il);
      llm_graph_context::cb((llm_graph_context *)this,cur,"ffn_norm",il);
      pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
      uVar13 = ggml_view_3d(pgVar6,cur,uVar11,iVar18,uVar3,cur->nb[1],cur->nb[2],0);
      x_prev = (ggml_tensor *)ggml_concat(pgVar6,uVar15,uVar13,1);
      pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
      sVar7 = pgVar12->nb[1];
      ggml_element_size(pgVar12);
      uVar13 = ggml_view_3d(pgVar6,pgVar12,uVar11,1,uVar3,sVar7);
      pgVar9 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
      sVar7 = cur->nb[1];
      sVar8 = cur->nb[2];
      lVar14 = ggml_element_size(cur);
      uVar15 = ggml_view_3d(pgVar9,cur,uVar11,1,uVar3,sVar7,sVar8,lVar14 * (ulong)(uVar1 * iVar18));
      pgVar10 = (ggml_tensor *)ggml_concat(pgVar6,uVar13,uVar15,1);
      pgVar10 = llm_graph_context::build_rwkv_token_shift_store
                          ((llm_graph_context *)this,pgVar10,
                           (this->super_llm_build_rwkv6_base).super_llm_graph_context.ubatch,il);
      ggml_build_forward_expand(gf,pgVar10);
      if (lVar19 == (this->super_llm_build_rwkv6_base).super_llm_graph_context.n_layer + -1) {
        pgVar10 = llm_graph_context::build_inp_out_ids((llm_graph_context *)this);
        pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,local_90,uVar11,
                                 (long)(this->super_llm_build_rwkv6_base).super_llm_graph_context.
                                       n_tokens);
        local_90 = (ggml_tensor *)ggml_get_rows(pgVar6,uVar13,pgVar10);
        pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,cur,uVar11,
                                 (long)(this->super_llm_build_rwkv6_base).super_llm_graph_context.
                                       n_tokens);
        cur = (ggml_tensor *)ggml_get_rows(pgVar6,uVar13,pgVar10);
        pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,x_prev,uVar11,
                                 (long)(this->super_llm_build_rwkv6_base).super_llm_graph_context.
                                       n_tokens);
        x_prev = (ggml_tensor *)ggml_get_rows(pgVar6,uVar13,pgVar10);
        pgVar6 = (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,pgVar17,uVar11,
                                 (long)(this->super_llm_build_rwkv6_base).super_llm_graph_context.
                                       n_tokens);
        ggml_get_rows(pgVar6,uVar13,pgVar10);
      }
      pgVar10 = llm_build_rwkv6_base::build_rwkv6_channel_mix
                          (&this->super_llm_build_rwkv6_base,
                           (llama_layer *)((long)&plVar5->attn_norm + local_80),cur,x_prev,
                           LLM_ARCH_RWKV6);
      pgVar10 = (ggml_tensor *)
                ggml_add((this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0,pgVar10,
                         local_90);
      uVar4 = ((this->super_llm_build_rwkv6_base).super_llm_graph_context.hparams)->
              rescale_every_n_layers;
      if ((uVar4 != 0) && ((il + 1U) % uVar4 == 0)) {
        pgVar10 = (ggml_tensor *)
                  ggml_scale(0x3f000000,
                             (this->super_llm_build_rwkv6_base).super_llm_graph_context.ctx0);
      }
      pgVar10 = llm_graph_context::build_cvec((llm_graph_context *)this,pgVar10,il);
      llm_graph_context::cb((llm_graph_context *)this,pgVar10,"l_out",il);
      local_80 = local_80 + 0x4f0;
    }
    pgVar10 = llm_graph_context::build_norm
                        ((llm_graph_context *)this,pgVar10,model->output_norm,model->output_norm_b,
                         LLM_NORM,-1);
    llm_graph_context::cb((llm_graph_context *)this,pgVar10,"result_norm",-1);
    ((this->super_llm_build_rwkv6_base).super_llm_graph_context.res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar10;
    pgVar10 = llm_graph_context::build_lora_mm((llm_graph_context *)this,model->output,pgVar10);
    llm_graph_context::cb((llm_graph_context *)this,pgVar10,"result_output",-1);
    ((this->super_llm_build_rwkv6_base).super_llm_graph_context.res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar10;
    ggml_build_forward_expand(gf,pgVar10);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2d3c,"GGML_ASSERT(%s) failed","hparams.token_shift_count == 2");
}

Assistant:

llm_build_rwkv6(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv6_base(model, params) {
        GGML_ASSERT(hparams.token_shift_count == 2);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);
        inpL = build_norm(inpL, model.tok_norm, model.tok_norm_b, LLM_NORM, -1);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], 0);
            ggml_tensor * ffn_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], n_embd * ggml_element_size(token_shift));

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    att_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv6_time_mix(gf, att_norm, x_prev, state_copy, state_mask, ubatch, il);

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            ggml_tensor * ffn_norm = build_norm(ffn_inp, layer->attn_norm_2, layer->attn_norm_2_b, LLM_NORM, il);
            cb(ffn_norm, "ffn_norm", il);

            x_prev = ggml_concat(
                    ctx0,
                    ffn_shift,
                    ggml_view_3d(ctx0, ffn_norm, n_embd, n_seq_tokens - 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], 0),
                    1
                    );

            token_shift = ggml_concat(ctx0,
                    ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm)),
                    ggml_view_3d(ctx0, ffn_norm, n_embd, 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(ffn_norm)),
                    1
                    );
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                ffn_inp  = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp,  n_embd, n_tokens), inp_out_ids);
                ffn_norm = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_norm, n_embd, n_tokens), inp_out_ids);
                x_prev   = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, x_prev,   n_embd, n_tokens), inp_out_ids);
                cur      = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, cur,      n_embd, n_tokens), inp_out_ids);
            }

            cur = build_rwkv6_channel_mix(layer, ffn_norm, x_prev, LLM_ARCH_RWKV6);
            cur = ggml_add(ctx0, cur, ffn_inp);

            if (hparams.rescale_every_n_layers != 0 && (il + 1) % hparams.rescale_every_n_layers == 0) {
                cur = ggml_scale(ctx0, cur, 0.5F);
            }

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }